

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

bool __thiscall
ddd::DaTrie<false,_true,_false>::is_terminal_(DaTrie<false,_true,_false> *this,uint32_t node_pos)

{
  pointer pBVar1;
  Bc BVar2;
  
  pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  BVar2 = pBVar1[node_pos];
  if (node_pos == 0 || -1 < BVar2._0_4_) {
    return false;
  }
  return (*(uint *)(&pBVar1->field_0x0 + ((ulong)BVar2 >> 0x1d & 0x3fffffff8)) & 0x7fffffff) ==
         node_pos;
}

Assistant:

bool is_terminal_(uint32_t node_pos) const {
    if (!bc_[node_pos].is_leaf()) {
      return false;
    }
    if (node_pos == ROOT_POS) {
      return false;
    }
    return (bc_[bc_[node_pos].check()].base() ^ node_pos) == 0;
  }